

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

char * loadFile(string *file)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar9;
  undefined1 local_268 [8];
  ifstream fin;
  char local_258 [504];
  string local_60;
  long *local_40;
  long local_38;
  long local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".","");
  bVar1 = fileExists(file,false,&local_60,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (bVar1) {
    std::ifstream::ifstream(local_268,(file->_M_dataplus)._M_p,_S_in|_S_bin);
    iVar2 = std::istream::tellg();
    std::istream::seekg((long)local_268,_S_beg);
    iVar3 = std::istream::tellg();
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)(iVar3 - iVar2)) {
      uVar7 = (long)(iVar3 - iVar2);
    }
    pcVar4 = (char *)operator_new__(uVar7);
    std::istream::seekg(local_268,0,0);
    std::istream::read(local_268,(long)pcVar4);
    std::ifstream::close();
    std::ifstream::~ifstream(local_268);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   "file does not exist ",file);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_268);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      uVar8 = (undefined4)*plVar6;
      uVar9 = *(undefined4 *)((long)plVar5 + 0x14);
      local_30 = *plVar6;
      uStack_28 = (undefined4)plVar5[3];
      uStack_24 = *(undefined4 *)((long)plVar5 + 0x1c);
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar6;
      uVar8 = extraout_XMM0_Da;
      uVar9 = extraout_XMM0_Db;
      local_40 = (long *)*plVar5;
    }
    local_38 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    log((double)CONCAT44(uVar9,uVar8));
    if (local_40 != &local_30) {
      operator_delete(local_40);
    }
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268);
    }
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

char * loadFile( string file )
{
	if (!fileExists(file))
	{
		log("file does not exist " + file + "\n");
		return NULL;
	}
	ifstream fin(file.c_str(), ifstream::in|ios::binary);
	int begin = fin.tellg();
	fin.seekg (0, ios::end);
	int size = (int)fin.tellg() - begin;
	char * buffer = new char[size];
	fin.seekg(0);
	fin.read(buffer, size);
	fin.close();
	//println("read " + str(size));
	return buffer;
}